

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

ActionResultHolder<std::optional<n_e_s::core::Pixel>_> *
testing::internal::
DownCast_<testing::internal::ActionResultHolder<std::optional<n_e_s::core::Pixel>>*,testing::internal::UntypedActionResultHolderBase>
          (UntypedActionResultHolderBase *f)

{
  bool bVar1;
  ostream *poVar2;
  long local_38;
  bool local_25;
  GTestLog local_14;
  ActionResultHolder<std::optional<n_e_s::core::Pixel>_> *local_10;
  UntypedActionResultHolderBase *f_local;
  
  local_25 = true;
  local_10 = (ActionResultHolder<std::optional<n_e_s::core::Pixel>_> *)f;
  if (f != (UntypedActionResultHolderBase *)0x0) {
    if (f == (UntypedActionResultHolderBase *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = __dynamic_cast(f,&UntypedActionResultHolderBase::typeinfo,
                                &ActionResultHolder<std::optional<n_e_s::core::Pixel>>::typeinfo,0);
    }
    local_25 = local_38 != 0;
  }
  bVar1 = IsTrue(local_25);
  if (!bVar1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x451);
    poVar2 = GTestLog::GetStream(&local_14);
    std::operator<<(poVar2,"Condition f == nullptr || dynamic_cast<To>(f) != nullptr failed. ");
    GTestLog::~GTestLog(&local_14);
  }
  return local_10;
}

Assistant:

inline To DownCast_(From* f) {  // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (false) {
  GTEST_INTENTIONAL_CONST_COND_POP_()
  const To to = nullptr;
  ::testing::internal::ImplicitCast_<From*>(to);
  }

#if GTEST_HAS_RTTI
  // RTTI: debug mode only!
  GTEST_CHECK_(f == nullptr || dynamic_cast<To>(f) != nullptr);
#endif
  return static_cast<To>(f);
}